

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ldf_asi(DisasContext_conflict8 *dc,TCGv_i32 addr,int insn,int size,int rd)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 arg4;
  TCGv_i32 pTVar3;
  TCGv_i32 ret;
  MemOp_conflict1 memop;
  uintptr_t o_1;
  TCGTemp *ts;
  int iVar4;
  MemOp_conflict1 memop_00;
  uintptr_t o;
  long lVar5;
  DisasASI DVar6;
  
  tcg_ctx = dc->uc->tcg_ctx;
  DVar6 = get_asi(dc,insn,size == 4 ^ MO_BEQ);
  memop_00 = DVar6.memop;
  iVar4 = DVar6.mem_idx;
  switch(DVar6.type) {
  case GET_ASI_EXCP:
    return;
  case GET_ASI_DIRECT:
    gen_address_mask(dc,addr);
    if (size == 0x10) {
      pTVar2 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx,(TCGv_i64)pTVar2,(TCGv_i64)addr,(long)iVar4,memop_00 | MO_ALIGN_4);
      tcg_gen_addi_i64_sparc64(tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,8);
      tcg_gen_qemu_ld_i64_sparc64
                (tcg_ctx,tcg_ctx->cpu_fpr[(ulong)((uint)rd >> 1) + 1],(TCGv_i64)addr,(long)iVar4,
                 memop_00 | MO_ALIGN_4);
      tcg_gen_mov_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fpr[(uint)rd >> 1],pTVar2);
      ts = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      goto LAB_00910ae5;
    }
    if (size != 8) {
      if (size == 4) {
        pTVar2 = get_temp_i32(dc);
        tcg_gen_qemu_ld_i32_sparc64(tcg_ctx,pTVar2,(TCGv_i64)addr,(long)iVar4,memop_00);
        gen_store_fpr_F(dc,rd,pTVar2);
        return;
      }
      iVar4 = 0x9e4;
LAB_00910b12:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                 ,iVar4,(char *)0x0);
    }
    pTVar1 = tcg_ctx->cpu_fpr[(uint)rd >> 1];
    memop_00 = memop_00 | MO_ALIGN_4;
    break;
  default:
    pTVar2 = tcg_const_i32_sparc64(tcg_ctx,DVar6.asi);
    arg4 = tcg_const_i32_sparc64(tcg_ctx,memop_00);
    save_state(dc);
    if (size == 0x10) {
      pTVar3 = tcg_temp_new_i64(tcg_ctx);
      gen_helper_ld_asi(tcg_ctx,pTVar3,tcg_ctx->cpu_env,addr,pTVar2,arg4);
      tcg_gen_addi_i64_sparc64(tcg_ctx,(TCGv_i64)addr,(TCGv_i64)addr,8);
      gen_helper_ld_asi(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fpr[(ulong)((uint)rd >> 1) + 1],
                        tcg_ctx->cpu_env,addr,pTVar2,arg4);
      tcg_gen_mov_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fpr[(uint)rd >> 1],pTVar3);
      tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    }
    else if (size == 8) {
      gen_helper_ld_asi(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fpr[(uint)rd >> 1],tcg_ctx->cpu_env,addr,
                        pTVar2,arg4);
    }
    else {
      if (size != 4) {
        iVar4 = 0xa2c;
        goto LAB_00910b12;
      }
      pTVar3 = tcg_temp_new_i64(tcg_ctx);
      gen_helper_ld_asi(tcg_ctx,pTVar3,tcg_ctx->cpu_env,addr,pTVar2,arg4);
      ret = get_temp_i32(dc);
      tcg_gen_extrl_i64_i32_sparc64(tcg_ctx,ret,(TCGv_i64)pTVar3);
      tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      gen_store_fpr_F(dc,rd,ret);
    }
    tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
    ts = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    goto LAB_00910ae5;
  case GET_ASI_BLOCK:
    if ((rd & 7U) != 0 || size != 8) {
LAB_0091089f:
      gen_exception(dc,0x10);
      return;
    }
    gen_address_mask(dc,addr);
    pTVar1 = tcg_const_i64_sparc64(tcg_ctx,8);
    memop = memop_00 | MO_ALIGN_64;
    for (lVar5 = 0;
        tcg_gen_qemu_ld_i64_sparc64
                  (tcg_ctx,tcg_ctx->cpu_fpr[(ulong)((uint)rd >> 1) + lVar5],(TCGv_i64)addr,
                   (long)iVar4,memop), lVar5 != 7; lVar5 = lVar5 + 1) {
      tcg_gen_add_i64(tcg_ctx,addr,addr,(TCGv_i32)pTVar1);
      memop = memop_00;
    }
    ts = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
LAB_00910ae5:
    tcg_temp_free_internal_sparc64(tcg_ctx,ts);
    return;
  case GET_ASI_SHORT:
    if (size != 8) goto LAB_0091089f;
    gen_address_mask(dc,addr);
    pTVar1 = tcg_ctx->cpu_fpr[(uint)rd >> 1];
  }
  tcg_gen_qemu_ld_i64_sparc64(tcg_ctx,pTVar1,(TCGv_i64)addr,(long)iVar4,memop_00);
  return;
}

Assistant:

static void gen_ldf_asi(DisasContext *dc, TCGv addr,
                        int insn, int size, int rd)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    DisasASI da = get_asi(dc, insn, (size == 4 ? MO_TEUL : MO_TEQ));
    TCGv_i32 d32;
    TCGv_i64 d64;

    switch (da.type) {
    case GET_ASI_EXCP:
        break;

    case GET_ASI_DIRECT:
        gen_address_mask(dc, addr);
        switch (size) {
        case 4:
            d32 = gen_dest_fpr_F(dc);
            tcg_gen_qemu_ld_i32(tcg_ctx, d32, addr, da.mem_idx, da.memop);
            gen_store_fpr_F(dc, rd, d32);
            break;
        case 8:
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], addr, da.mem_idx,
                                da.memop | MO_ALIGN_4);
            break;
        case 16:
            d64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_qemu_ld_i64(tcg_ctx, d64, addr, da.mem_idx, da.memop | MO_ALIGN_4);
            tcg_gen_addi_tl(tcg_ctx, addr, addr, 8);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd/2+1], addr, da.mem_idx,
                                da.memop | MO_ALIGN_4);
            tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], d64);
            tcg_temp_free_i64(tcg_ctx, d64);
            break;
        default:
            g_assert_not_reached();
        }
        break;

    case GET_ASI_BLOCK:
        /* Valid for lddfa on aligned registers only.  */
        if (size == 8 && (rd & 7) == 0) {
            MemOp memop;
            TCGv eight;
            int i;

            gen_address_mask(dc, addr);

            /* The first operation checks required alignment.  */
            memop = da.memop | MO_ALIGN_64;
            eight = tcg_const_tl(tcg_ctx, 8);
            for (i = 0; ; ++i) {
                tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2 + i], addr,
                                    da.mem_idx, memop);
                if (i == 7) {
                    break;
                }
                tcg_gen_add_tl(tcg_ctx, addr, addr, eight);
                memop = da.memop;
            }
            tcg_temp_free(tcg_ctx, eight);
        } else {
            gen_exception(dc, TT_ILL_INSN);
        }
        break;

    case GET_ASI_SHORT:
        /* Valid for lddfa only.  */
        if (size == 8) {
            gen_address_mask(dc, addr);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], addr, da.mem_idx, da.memop);
        } else {
            gen_exception(dc, TT_ILL_INSN);
        }
        break;

    default:
        {
            TCGv_i32 r_asi = tcg_const_i32(tcg_ctx, da.asi);
            TCGv_i32 r_mop = tcg_const_i32(tcg_ctx, da.memop);

            save_state(dc);
            /* According to the table in the UA2011 manual, the only
               other asis that are valid for ldfa/lddfa/ldqfa are
               the NO_FAULT asis.  We still need a helper for these,
               but we can just use the integer asi helper for them.  */
            switch (size) {
            case 4:
                d64 = tcg_temp_new_i64(tcg_ctx);
                gen_helper_ld_asi(tcg_ctx, d64, tcg_ctx->cpu_env, addr, r_asi, r_mop);
                d32 = gen_dest_fpr_F(dc);
                tcg_gen_extrl_i64_i32(tcg_ctx, d32, d64);
                tcg_temp_free_i64(tcg_ctx, d64);
                gen_store_fpr_F(dc, rd, d32);
                break;
            case 8:
                gen_helper_ld_asi(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], tcg_ctx->cpu_env, addr, r_asi, r_mop);
                break;
            case 16:
                d64 = tcg_temp_new_i64(tcg_ctx);
                gen_helper_ld_asi(tcg_ctx, d64, tcg_ctx->cpu_env, addr, r_asi, r_mop);
                tcg_gen_addi_tl(tcg_ctx, addr, addr, 8);
                gen_helper_ld_asi(tcg_ctx, tcg_ctx->cpu_fpr[rd/2+1], tcg_ctx->cpu_env, addr, r_asi, r_mop);
                tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd / 2], d64);
                tcg_temp_free_i64(tcg_ctx, d64);
                break;
            default:
                g_assert_not_reached();
            }
            tcg_temp_free_i32(tcg_ctx, r_mop);
            tcg_temp_free_i32(tcg_ctx, r_asi);
        }
        break;
    }
}